

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argtable3.c
# Opt level: O2

void arg_print_glossary(FILE *fp,void **argtable,char *format)

{
  arg_dstr_t ds;
  
  ds = arg_dstr_create();
  arg_print_glossary_ds(ds,argtable,format);
  fputs(ds->data,(FILE *)fp);
  arg_dstr_destroy(ds);
  return;
}

Assistant:

void arg_print_glossary(FILE* fp, void** argtable, const char* format) {
    arg_dstr_t ds = arg_dstr_create();
    arg_print_glossary_ds(ds, argtable, format);
    fputs(arg_dstr_cstr(ds), fp);
    arg_dstr_destroy(ds);
}